

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeLoad
          (ScalarReplacementPass *this,Instruction *load,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  Instruction *this_00;
  ScalarReplacementPass *pSVar1;
  pointer ppIVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  array<signed_char,_4UL> aVar5;
  array<signed_char,_4UL> aVar6;
  Instruction *pIVar7;
  Operand *pOVar8;
  mapped_type *ppBVar9;
  uint uVar10;
  pointer ppIVar11;
  pointer ppIVar12;
  IRContext *pIVar13;
  iterator where;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> loads;
  Instruction *var;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_110;
  undefined1 local_108 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_e0;
  pointer local_d8;
  undefined1 local_d0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_b0;
  Instruction *local_a8;
  uint32_t local_9c;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_98;
  BasicBlock *local_80;
  ScalarReplacementPass *local_78;
  Instruction *local_70;
  OperandList local_68;
  pointer local_48;
  IRContext *local_40;
  Instruction *local_38;
  
  local_80 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,load);
  local_98.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (Instruction **)0x0;
  local_98.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Instruction **)0x0;
  local_98.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Instruction **)0x0;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::reserve
            (&local_98,
             (long)(replacements->
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(replacements->
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppIVar11 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppIVar12 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_110._M_head_impl = load;
  local_78 = this;
  ppIVar2 = ppIVar12;
  if (ppIVar11 != ppIVar12) {
    do {
      local_48 = ppIVar2;
      local_70 = *ppIVar11;
      if (local_70->opcode_ == OpVariable) {
        local_d8 = ppIVar11;
        pIVar7 = GetStorageType(this,local_70);
        uVar3 = Pass::TakeNextId((Pass *)this);
        if (uVar3 == 0) {
          uVar3 = 0;
          goto LAB_005338ef;
        }
        local_38 = (Instruction *)operator_new(0x70);
        local_40 = (this->super_MemPass).super_Pass.context_;
        aVar5._M_elems[0] = '\0';
        aVar5._M_elems[1] = '\0';
        aVar5._M_elems[2] = '\0';
        aVar5._M_elems[3] = '\0';
        uVar4 = 0;
        if (pIVar7->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
        }
        local_9c = uVar4;
        if (local_70->has_result_id_ == true) {
          aVar5._M_elems =
               (_Type)Instruction::GetSingleWordOperand(local_70,(uint)local_70->has_type_id_);
        }
        local_d0._0_8_ = &PTR__SmallVector_00930a20;
        local_d0._24_8_ = local_d0 + 0x10;
        local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_d0._8_8_ = 1;
        local_108._0_4_ = 1;
        local_108._8_8_ = &PTR__SmallVector_00930a20;
        local_108._16_8_ = (pointer)0x0;
        local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_108._32_8_ = local_108 + 0x18;
        local_d0._16_4_ = aVar5._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_d0);
        local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_68,local_108,&local_d8);
        pIVar7 = local_38;
        Instruction::Instruction(local_38,local_40,OpLoad,local_9c,uVar3,&local_68);
        local_a8 = pIVar7;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_68);
        ppIVar11 = local_d8;
        local_108._8_8_ = &PTR__SmallVector_00930a20;
        if (local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_e0,local_e0._M_head_impl);
        }
        local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_d0._0_8_ = &PTR__SmallVector_00930a20;
        if (local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_b0,local_b0._M_head_impl);
        }
        uVar10 = (load->has_result_id_ & 1) + 1;
        if (load->has_type_id_ == false) {
          uVar10 = (uint)load->has_result_id_;
        }
        if (1 < (int)((ulong)((long)(load->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(load->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar10) {
          uVar3 = 1;
          do {
            pOVar8 = Instruction::GetInOperand(load,uVar3);
            local_108._0_4_ = pOVar8->type;
            local_108._8_8_ = &PTR__SmallVector_00930a20;
            local_108._16_8_ = (pointer)0x0;
            local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_108._32_8_ = local_108 + 0x18;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),&pOVar8->words);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
            emplace_back<spvtools::opt::Operand>(&local_a8->operands_,(Operand *)local_108);
            local_108._8_8_ = &PTR__SmallVector_00930a20;
            if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )local_e0._M_head_impl !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_e0,local_e0._M_head_impl);
            }
            uVar3 = uVar3 + 1;
            uVar10 = (load->has_result_id_ & 1) + 1;
            if (load->has_type_id_ == false) {
              uVar10 = (uint)load->has_result_id_;
            }
          } while (uVar3 < (int)((ulong)((long)(load->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(load->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                           -0x55555555 - uVar10);
        }
        InstructionList::iterator::InsertBefore
                  ((iterator *)local_108,
                   (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&local_110);
        this = local_78;
        local_110._M_head_impl = (Instruction *)local_108._0_8_;
        pIVar13 = (local_78->super_MemPass).super_Pass.context_;
        if ((pIVar13->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar13);
        }
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((pIVar13->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,local_110._M_head_impl);
        pIVar13 = (this->super_MemPass).super_Pass.context_;
        local_108._0_8_ = local_110._M_head_impl;
        if ((pIVar13->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
          ppBVar9 = std::__detail::
                    _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&pIVar13->instr_to_block_,(key_type *)local_108);
          *ppBVar9 = local_80;
        }
        Instruction::UpdateDebugInfoFrom(local_110._M_head_impl,load);
        local_108._0_8_ = local_110._M_head_impl;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&local_98,(Instruction **)local_108);
        ppIVar12 = local_48;
        if (local_a8 != (Instruction *)0x0) {
          (*(local_a8->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase
            [1])();
        }
      }
      else if (local_98.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
               local_98.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        _M_realloc_insert<spvtools::opt::Instruction*const&>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&local_98,
                   (iterator)
                   local_98.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *local_98.
         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_70;
        local_98.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_98.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppIVar11 = ppIVar11 + 1;
      ppIVar2 = local_48;
    } while (ppIVar11 != ppIVar12);
  }
  uVar4 = Pass::TakeNextId((Pass *)this);
  uVar3 = 0;
  if (uVar4 != 0) {
    local_110._M_head_impl = load;
    pIVar7 = (Instruction *)operator_new(0x70);
    pIVar13 = (this->super_MemPass).super_Pass.context_;
    if (load->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(load,0);
    }
    local_108._0_8_ = (Instruction *)0x0;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_8_ = (pointer)0x0;
    local_d8 = (pointer)CONCAT44(local_d8._4_4_,uVar4);
    Instruction::Instruction
              (pIVar7,pIVar13,OpCompositeConstruct,uVar3,uVar4,
               (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_108)
    ;
    local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar7;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_108)
    ;
    ppIVar11 = local_98.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_98.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppIVar12 = local_98.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_00 = *ppIVar12;
        aVar6._M_elems[0] = '\0';
        aVar6._M_elems[1] = '\0';
        aVar6._M_elems[2] = '\0';
        aVar6._M_elems[3] = '\0';
        if (this_00->has_result_id_ == true) {
          aVar6._M_elems =
               (_Type)Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
        }
        local_d0._0_8_ = &PTR__SmallVector_00930a20;
        local_d0._24_8_ = local_d0 + 0x10;
        local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_d0._8_8_ = 1;
        local_108._0_4_ = 1;
        local_108._8_8_ = &PTR__SmallVector_00930a20;
        local_108._16_8_ = (pointer)0x0;
        local_108._32_8_ = local_108 + 0x18;
        local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_d0._16_4_ = aVar6._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_d0);
        local_d0._0_8_ = &PTR__SmallVector_00930a20;
        if (local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_b0,local_b0._M_head_impl);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&pIVar7->operands_,(Operand *)local_108);
        local_108._8_8_ = &PTR__SmallVector_00930a20;
        if (local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_e0,local_e0._M_head_impl);
        }
        ppIVar12 = ppIVar12 + 1;
      } while (ppIVar12 != ppIVar11);
    }
    InstructionList::iterator::InsertBefore
              ((iterator *)local_108,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&local_110);
    pSVar1 = local_78;
    local_110._M_head_impl = (Instruction *)local_108._0_8_;
    pIVar13 = (local_78->super_MemPass).super_Pass.context_;
    if ((pIVar13->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar13);
    }
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar13->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               local_110._M_head_impl);
    Instruction::UpdateDebugInfoFrom(local_110._M_head_impl,load);
    pIVar13 = (pSVar1->super_MemPass).super_Pass.context_;
    local_108._0_8_ = local_110._M_head_impl;
    uVar3 = (uint32_t)local_d8;
    if ((pIVar13->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      ppBVar9 = std::__detail::
                _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pIVar13->instr_to_block_,(key_type *)local_108);
      *ppBVar9 = local_80;
      pIVar13 = (pSVar1->super_MemPass).super_Pass.context_;
    }
    uVar4 = 0;
    if (load->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(load,(uint)load->has_type_id_);
    }
    IRContext::ReplaceAllUsesWith(pIVar13,uVar4,uVar3);
    if ((Instruction *)
        local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
      (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)
        &(local_68.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start)->type)->_vptr_IntrusiveNodeBase[1])();
    }
    uVar3 = 1;
  }
LAB_005338ef:
  if (local_98.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Instruction **)0x0) {
    operator_delete(local_98.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return SUB41(uVar3,0);
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeLoad(
    Instruction* load, const std::vector<Instruction*>& replacements) {
  // Replaces the load of the entire composite with a load from each replacement
  // variable followed by a composite construction.
  BasicBlock* block = context()->get_instr_block(load);
  std::vector<Instruction*> loads;
  loads.reserve(replacements.size());
  BasicBlock::iterator where(load);
  for (auto var : replacements) {
    // Create a load of each replacement variable.
    if (var->opcode() != spv::Op::OpVariable) {
      loads.push_back(var);
      continue;
    }

    Instruction* type = GetStorageType(var);
    uint32_t loadId = TakeNextId();
    if (loadId == 0) {
      return false;
    }
    std::unique_ptr<Instruction> newLoad(
        new Instruction(context(), spv::Op::OpLoad, type->result_id(), loadId,
                        std::initializer_list<Operand>{
                            {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
    // Copy memory access attributes which start at index 1. Index 0 is the
    // pointer to load.
    for (uint32_t i = 1; i < load->NumInOperands(); ++i) {
      Operand copy(load->GetInOperand(i));
      newLoad->AddOperand(std::move(copy));
    }
    where = where.InsertBefore(std::move(newLoad));
    get_def_use_mgr()->AnalyzeInstDefUse(&*where);
    context()->set_instr_block(&*where, block);
    where->UpdateDebugInfoFrom(load);
    loads.push_back(&*where);
  }

  // Construct a new composite.
  uint32_t compositeId = TakeNextId();
  if (compositeId == 0) {
    return false;
  }
  where = load;
  std::unique_ptr<Instruction> compositeConstruct(
      new Instruction(context(), spv::Op::OpCompositeConstruct, load->type_id(),
                      compositeId, {}));
  for (auto l : loads) {
    Operand op(SPV_OPERAND_TYPE_ID,
               std::initializer_list<uint32_t>{l->result_id()});
    compositeConstruct->AddOperand(std::move(op));
  }
  where = where.InsertBefore(std::move(compositeConstruct));
  get_def_use_mgr()->AnalyzeInstDefUse(&*where);
  where->UpdateDebugInfoFrom(load);
  context()->set_instr_block(&*where, block);
  context()->ReplaceAllUsesWith(load->result_id(), compositeId);
  return true;
}